

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

BIND_FLAGS Diligent::SwapChainUsageFlagsToBindFlags(SWAP_CHAIN_USAGE_FLAGS SwapChainUsage)

{
  SWAP_CHAIN_USAGE_FLAGS SVar1;
  string msg;
  BIND_FLAGS local_54;
  string local_50;
  
  local_54 = BIND_NONE;
  do {
    if (SwapChainUsage == SWAP_CHAIN_USAGE_NONE) {
      return local_54;
    }
    SVar1 = -SwapChainUsage & SwapChainUsage;
    SwapChainUsage = SwapChainUsage ^ SVar1;
    switch(SVar1) {
    case SWAP_CHAIN_USAGE_RENDER_TARGET:
      local_54 = local_54 | BIND_RENDER_TARGET;
      break;
    case SWAP_CHAIN_USAGE_SHADER_RESOURCE:
      local_54 = local_54 | BIND_SHADER_RESOURCE;
      break;
    default:
      FormatString<char[33]>(&local_50,(char (*) [33])"Unexpected swap chain usage flag");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SwapChainUsageFlagsToBindFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x762);
      std::__cxx11::string::~string((string *)&local_50);
      break;
    case SWAP_CHAIN_USAGE_INPUT_ATTACHMENT:
      local_54 = local_54 | BIND_INPUT_ATTACHMENT;
      break;
    case SWAP_CHAIN_USAGE_COPY_SOURCE:
      break;
    }
  } while( true );
}

Assistant:

BIND_FLAGS SwapChainUsageFlagsToBindFlags(SWAP_CHAIN_USAGE_FLAGS SwapChainUsage)
{
    BIND_FLAGS BindFlags = BIND_NONE;
    static_assert(SWAP_CHAIN_USAGE_LAST == 8, "Did you add a new swap chain usage flag? Please handle it here.");
    while (SwapChainUsage != SWAP_CHAIN_USAGE_NONE)
    {
        SWAP_CHAIN_USAGE_FLAGS SCUsageBit = ExtractLSB(SwapChainUsage);
        switch (SCUsageBit)
        {
            case SWAP_CHAIN_USAGE_RENDER_TARGET:
                BindFlags |= BIND_RENDER_TARGET;
                break;

            case SWAP_CHAIN_USAGE_SHADER_RESOURCE:
                BindFlags |= BIND_SHADER_RESOURCE;
                break;

            case SWAP_CHAIN_USAGE_INPUT_ATTACHMENT:
                BindFlags |= BIND_INPUT_ATTACHMENT;
                break;

            case SWAP_CHAIN_USAGE_COPY_SOURCE:
                // No special bind flag needed
                break;

            default:
                UNEXPECTED("Unexpected swap chain usage flag");
        }
    }
    return BindFlags;
}